

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O3

void __thiscall
RenX_ChatLogPlugin::WriteToLog
          (RenX_ChatLogPlugin *this,Server *server,PlayerInfo *player,string_view message,
          string *in_prefix)

{
  char cVar1;
  undefined8 *puVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  undefined1 *puVar5;
  
  PrepFile(this);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    puVar2 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
    RenX::Server::getSocketPort();
    puVar5 = &this->field_0xd0;
    __s = (char *)getTimeFormat("%T");
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)puVar5 + -0x18) + (int)puVar5);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar5,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar5," ",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar5,(char *)*puVar2,puVar2[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(in_prefix->_M_dataplus)._M_p,in_prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(player->name)._M_dataplus._M_p,(player->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    std::ostream::write((char *)poVar4,(long)message._M_str);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void RenX_ChatLogPlugin::WriteToLog(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message, std::string in_prefix)
{
	// Check if new file needs to be opened
	PrepFile();

	if (!fs.is_open()) {
		return;
	}

	const std::string& serverHostname = server.getSocketHostname();
	unsigned short serverPort = server.getSocketPort();

	fs << getTimeFormat("%T")
		<< " "
		<< serverHostname
		<< ":"
		<< serverPort
		<< " "
		<< in_prefix
		<< " "
		<< player.name
		<< ": "
		<< message
		<< std::endl;
}